

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::update(Texture *this,Window *window,uint x,uint y)

{
  PFNGLCOPYTEXSUBIMAGE2DPROC p_Var1;
  bool bVar2;
  Vector2u VVar3;
  Uint64 UVar4;
  GLint in_ECX;
  GLint in_EDX;
  WindowBase *in_RSI;
  long in_RDI;
  TextureSaver save;
  TransientContextLock lock;
  undefined4 in_stack_ffffffffffffff84;
  Window *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uStack_38;
  uint local_34;
  
  if ((*(int *)(in_RDI + 0x10) != 0) &&
     (bVar2 = Window::setActive(in_stack_ffffffffffffff88,
                                SUB41((uint)in_stack_ffffffffffffff84 >> 0x18,0)), bVar2)) {
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
              );
    priv::TextureSaver::TextureSaver((TextureSaver *)0x21956f);
    (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0x10));
    p_Var1 = sf_glad_glCopyTexSubImage2D;
    VVar3 = WindowBase::getSize(in_RSI);
    local_34 = VVar3.x;
    VVar3 = WindowBase::getSize(in_RSI);
    uStack_38 = VVar3.y;
    (*p_Var1)(0xde1,0,in_EDX,in_ECX,0,0,local_34,uStack_38);
    (*sf_glad_glTexParameteri)(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
    *(undefined1 *)(in_RDI + 0x19) = 0;
    *(undefined1 *)(in_RDI + 0x17) = 1;
    UVar4 = anon_unknown.dwarf_1bc837::TextureImpl::getUniqueId();
    *(Uint64 *)(in_RDI + 0x20) = UVar4;
    (*sf_glad_glFlush)();
    priv::TextureSaver::~TextureSaver((TextureSaver *)0x219683);
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_ffffffffffffff84,uStack_38));
  }
  return;
}

Assistant:

void Texture::update(const Window& window, unsigned int x, unsigned int y)
{
    assert(x + window.getSize().x <= m_size.x);
    assert(y + window.getSize().y <= m_size.y);

    if (m_texture && window.setActive(true))
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the back-buffer to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glCopyTexSubImage2D(GL_TEXTURE_2D, 0, static_cast<GLint>(x), static_cast<GLint>(y), 0, 0, static_cast<GLsizei>(window.getSize().x), static_cast<GLsizei>(window.getSize().y)));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = true;
        m_cacheId = TextureImpl::getUniqueId();

        // Force an OpenGL flush, so that the texture will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}